

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline_private.hh
# Opt level: O0

void __thiscall qpdf::pl::String::~String(String *this)

{
  String *this_local;
  
  ~String(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

~String() final = default;